

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> __thiscall
fmt::v8::detail::
write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128,char16_t>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          unsigned___int128 value,uint prefix,basic_format_specs<char16_t> *specs,
          digit_grouping<char16_t> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar1;
  uint uVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  char cVar9;
  undefined8 *in_R9;
  int num_digits;
  undefined4 in_stack_ffffffffffffff78;
  detail local_78 [40];
  anon_class_32_4_dca7119b local_50;
  
  iVar4 = (int)specs;
  n._4_4_ = iVar4;
  n._0_4_ = in_stack_ffffffffffffff78;
  n._8_8_ = grouping;
  iVar5 = iVar4;
  iVar1 = count_digits_fallback<unsigned__int128>((detail *)out.container,(unsigned___int128)n);
  value_00._4_4_ = iVar5;
  value_00._0_4_ = iVar1;
  value_00._8_8_ = grouping;
  format_decimal<char,unsigned__int128>
            (local_78,(char *)out.container,(unsigned___int128)value_00,prefix);
  if (*(short *)(in_R9 + 4) != 0) {
    pcVar7 = (char *)*in_R9;
    pcVar6 = pcVar7 + in_R9[1];
    iVar5 = 0;
    iVar8 = 0;
    do {
      if (pcVar7 == pcVar6) {
        cVar9 = pcVar6[-1];
        pcVar7 = pcVar6;
      }
      else {
        cVar9 = *pcVar7;
        if ((byte)(cVar9 + 0x81U) < 0x82) goto LAB_0016770e;
        pcVar7 = pcVar7 + 1;
      }
      iVar8 = iVar8 + cVar9;
      if (iVar1 <= iVar8) goto LAB_0016770e;
      iVar5 = iVar5 + 1;
    } while( true );
  }
  iVar5 = 0;
LAB_0016770e:
  uVar2 = ((iVar1 + 1) - (uint)(iVar4 == 0)) + iVar5;
  if (-1 < (int)uVar2) {
    local_50.prefix = (uint *)&stack0xffffffffffffff7c;
    local_50.digits = (char (*) [40])local_78;
    local_50.num_digits = (int *)&stack0xffffffffffffff78;
    bVar3 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128,char16_t>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::digit_grouping<char16_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this,
                       (basic_format_specs<char16_t> *)grouping,(ulong)uVar2,(ulong)uVar2,&local_50)
    ;
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar3.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
             ,0x195,"negative value");
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}